

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  IntruleType *this_00;
  int iVar1;
  undefined4 uVar2;
  int64_t nelem;
  TPZConnect *pTVar3;
  TPZGeoEl *this_01;
  long *plVar4;
  int icon;
  int i;
  long lVar5;
  int iVar6;
  int local_e0;
  int order_1;
  TPZStack<int,_10> facesides;
  TPZManVector<int,_3> ord;
  TPZManVector<int,_3> order;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01733f68;
  TPZIntelGen<pzshape::TPZShapeTetra>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeTetra>,&PTR_PTR_0172f9a0,mesh,gel,1);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_0172f5c8;
  facesides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)
       CONCAT44(facesides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec._4_4_,1);
  TPZManVector<int,_4>::TPZManVector(&this->fSideOrient,4,(int *)&facesides);
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  facesides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)0xffffffffffffffff;
  TPZManVector<long,_5>::TPZManVector(&this->fConnectIndexes,5,(long *)&facesides);
  this->fhdivfam = hdivfam;
  (this->super_TPZIntelGen<pzshape::TPZShapeTetra>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = mesh->fDefaultOrder;
  TPZManVector<long,_5>::Resize(&this->fConnectIndexes,5);
  gel->fReference = (TPZCompEl *)this;
  TPZStack<int,_10>::TPZStack(&facesides);
  pztopology::TPZTetrahedron::LowerDimensionSides(0xe,&facesides,2);
  TPZStack<int,_10>::Push(&facesides,0xe);
  for (lVar5 = 0; lVar5 < facesides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
      lVar5 = lVar5 + 1) {
    iVar1 = facesides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar5];
    nelem = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x370))(this,iVar1);
    (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar5] = nelem;
    pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
    pTVar3->fNElConnected = pTVar3->fNElConnected + 1;
    (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl
                + 0x378))(this,iVar1);
  }
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x338))(this,0xe);
  iVar6 = iVar1 * 2 + 2;
  this_00 = &(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).fIntRule;
  local_e0 = iVar6;
  iVar1 = TPZIntTetra3D::GetMaxOrder(this_00);
  if (iVar1 < iVar6) {
    local_e0 = TPZIntTetra3D::GetMaxOrder(this_00);
  }
  TPZManVector<int,_3>::TPZManVector(&order,3,&local_e0);
  TPZIntTetra3D::SetOrder(this_00,&order.super_TPZVec<int>,0);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    this_01 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar1 = TPZGeoEl::NormalOrientation(this_01,(int)lVar5 + 10);
    (this->fSideOrient).super_TPZVec<int>.fStore[lVar5] = iVar1;
  }
  lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))(this);
  if (lVar5 != 0) {
    plVar4 = (long *)__dynamic_cast(lVar5,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar4 != (long *)0x0) {
      uVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x268))(this);
      order_1 = (**(code **)(*plVar4 + 0x58))(plVar4,uVar2);
      iVar1 = (**(code **)(*(long *)gel + 0x210))(gel);
      TPZManVector<int,_3>::TPZManVector(&ord,(long)iVar1,&order_1);
      TPZIntTetra3D::SetOrder(this_00,&ord.super_TPZVec<int>,0);
      TPZManVector<int,_3>::~TPZManVector(&ord);
    }
  }
  if (this->fhdivfam == EHDivConstant) {
    iVar1 = 0;
    while( true ) {
      iVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x90))(this);
      if (iVar6 <= iVar1) break;
      lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa8))(this,iVar1);
      iVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x260))
                        (this,iVar1,*(undefined1 *)(lVar5 + 0x14));
      if (*(int *)(lVar5 + 0x18) != iVar6) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                   ,0x67);
      }
      iVar1 = iVar1 + 1;
    }
  }
  TPZManVector<int,_3>::~TPZManVector(&order);
  TPZManVector<int,_10>::~TPZManVector(&facesides.super_TPZManVector<int,_10>);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel,1), fSideOrient(TSHAPE::NFacets,1), fhdivfam(hdivfam) {
	this->TPZInterpolationSpace::fPreferredOrder = mesh.GetDefaultOrder();
	int nconflux= TPZCompElHDiv::NConnects();
    this->fConnectIndexes.Resize(nconflux);
	gel->SetReference(this);

//    int nfaces = TSHAPE::NumSides(TSHAPE::Dimension-1);
    TPZStack<int> facesides;
    TSHAPE::LowerDimensionSides(TSHAPE::NSides-1,facesides,TSHAPE::Dimension-1);
    facesides.Push(TSHAPE::NSides-1);
	for(int i=0;i< facesides.size(); i++)
	{
        int sideaux= facesides[i];
		this->fConnectIndexes[i] = this->CreateMidSideConnect(sideaux);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "After creating last flux connect " << i << std::endl;
            //	this->Print(sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

		mesh.ConnectVec()[this->fConnectIndexes[i]].IncrementElConnected();
		this->IdentifySideOrder(sideaux);
    }


    int sideorder = EffectiveSideOrder(TSHAPE::NSides-1);
//    if(TSHAPE::Type()==EQuadrilateral)
//    {
//        sideorder++;
//    }

    sideorder++;

	sideorder = 2*sideorder;
	if (sideorder > this->fIntRule.GetMaxOrder()) sideorder = this->fIntRule.GetMaxOrder();
	TPZManVector<int,3> order(3,sideorder);
	this->fIntRule.SetOrder(order);
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    for(int side = firstside ; side < TSHAPE::NSides-1; side++ )
    {
        fSideOrient[side-firstside] = this->Reference()->NormalOrientation(side);
    }
    auto *mat =
        dynamic_cast<TPZMatSingleSpace *>(this->Material());
    if (mat)
    {
        int order = mat->IntegrationRuleOrder(MaxOrder());
        TPZManVector<int,3> ord(gel->Dimension(),order);
        this->fIntRule.SetOrder(ord);
    }

    if (fhdivfam == HDivFamily::EHDivConstant) {
        // For HDiv constant, polynomial order was compatibilized in connectorders, 
        // see TPZShapeHDivConstant<TSHAPE>::Initialize. So now we need to update
        // the number of shape functions and also the integration rule
        if (TSHAPE::Type() == ETriangle || TSHAPE::Type() == EQuadrilateral || TSHAPE::Type() == ETetraedro){
            for (int icon = 0; icon < this->NConnects(); icon++)
            {
                TPZConnect &c = this->Connect(icon);
                int nShapeF = NConnectShapeF(icon,c.Order());
                if (c.NShape() != nShapeF){
                    DebugStop();
                }
            }
        }
    }
}